

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5564d0::HighbdDrPredTest_OperationCheck_Test::TestBody
          (HighbdDrPredTest_OperationCheck_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((this->super_HighbdDrPredTest).
      super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
      .params_.tst_fn !=
      (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
       *)0x0) {
    iVar3 = 0;
    while ((this->super_HighbdDrPredTest).
           super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
           .enable_upsample_ = iVar3, iVar3 < 2) {
      for (iVar3 = (this->super_HighbdDrPredTest).
                   super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                   .start_angle_;
          iVar3 < (this->super_HighbdDrPredTest).
                  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                  .stop_angle_; iVar3 = iVar3 + 1) {
        iVar1 = av1_get_dx(iVar3);
        (this->super_HighbdDrPredTest).
        super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
        .dx_ = iVar1;
        iVar2 = av1_get_dy(iVar3);
        (this->super_HighbdDrPredTest).
        super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
        .dy_ = iVar2;
        if (iVar2 != 0 && iVar1 != 0) {
          DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          ::RunTest((DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                     *)this,false,false,iVar3);
        }
      }
      iVar3 = (this->super_HighbdDrPredTest).
              super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
              .enable_upsample_ + 1;
    }
  }
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, OperationCheck) {
  if (params_.tst_fn == nullptr) return;
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int angle = start_angle_; angle < stop_angle_; angle++) {
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      if (dx_ && dy_) RunTest(false, false, angle);
    }
  }
}